

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

void __thiscall TokenPattern::TokenPattern(TokenPattern *this,TokenPattern *tokpat)

{
  int iVar1;
  undefined4 extraout_var;
  
  (this->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->toklist).super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*tokpat->pattern->_vptr_Pattern[2])();
  this->pattern = (Pattern *)CONCAT44(extraout_var,iVar1);
  std::vector<Token_*,_std::allocator<Token_*>_>::operator=(&this->toklist,&tokpat->toklist);
  this->leftellipsis = tokpat->leftellipsis;
  this->rightellipsis = tokpat->rightellipsis;
  return;
}

Assistant:

TokenPattern::TokenPattern(const TokenPattern &tokpat)

{
  pattern = tokpat.pattern->simplifyClone();
  toklist = tokpat.toklist;
  leftellipsis = tokpat.leftellipsis;
  rightellipsis = tokpat.rightellipsis;
}